

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExistingFileNamer.cpp
# Opt level: O1

void __thiscall
ApprovalTests::ExistingFileNamer::ExistingFileNamer
          (ExistingFileNamer *this,string *filePath_,Options *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_ApprovalNamer)._vptr_ApprovalNamer = (_func_int **)&PTR__ExistingFileNamer_001d3628;
  paVar1 = &(this->filePath).field_2;
  (this->filePath)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (filePath_->_M_dataplus)._M_p;
  paVar2 = &filePath_->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&filePath_->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->filePath).field_2 + 8) = uVar4;
  }
  else {
    (this->filePath)._M_dataplus._M_p = pcVar3;
    (this->filePath).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->filePath)._M_string_length = filePath_->_M_string_length;
  (filePath_->_M_dataplus)._M_p = (pointer)paVar2;
  filePath_->_M_string_length = 0;
  (filePath_->field_2)._M_local_buf[0] = '\0';
  this->options_ = options;
  return;
}

Assistant:

ExistingFileNamer::ExistingFileNamer(std::string filePath_, const Options& options)
        : filePath(std::move(filePath_)), options_(options)
    {
    }